

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O0

void __thiscall DisplayConsole::render(DisplayConsole *this,SatLookAngles *TLEsAndLAs)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  string local_78;
  CoordTopocentric *local_58;
  CoordTopocentric *la;
  Tle *tle;
  pair<Tle,_CoordTopocentric> *TL;
  iterator __end1;
  iterator __begin1;
  SatLookAngles *__range1;
  size_t nTles;
  size_t count;
  SatLookAngles *TLEsAndLAs_local;
  DisplayConsole *this_local;
  
  nTles = 0;
  sVar2 = SatLookAngles::size(TLEsAndLAs);
  __end1 = SatLookAngles::begin(TLEsAndLAs);
  TL = (pair<Tle,_CoordTopocentric> *)SatLookAngles::end(TLEsAndLAs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<Tle,_CoordTopocentric>_*,_std::vector<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>_>
                                *)&TL);
    if (!bVar1) break;
    la = (CoordTopocentric *)
         __gnu_cxx::
         __normal_iterator<std::pair<Tle,_CoordTopocentric>_*,_std::vector<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>_>
         ::operator*(&__end1);
    local_58 = &((reference)la)->second;
    tle = (Tle *)la;
    poVar3 = std::operator<<((ostream *)&std::cout,"[+] [");
    nTles = nTles + 1;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,nTles);
    poVar3 = std::operator<<(poVar3,'/');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3,'(');
    Tle::Name_abi_cxx11_(&local_78,(Tle *)la);
    poVar3 = std::operator<<(poVar3,(string *)&local_78);
    poVar3 = std::operator<<(poVar3,"): LookAngle: ");
    poVar3 = operator<<(poVar3,local_58);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_78);
    __gnu_cxx::
    __normal_iterator<std::pair<Tle,_CoordTopocentric>_*,_std::vector<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void DisplayConsole::render(SatLookAngles &TLEsAndLAs) {
  size_t count = 0;
  const size_t nTles = TLEsAndLAs.size();
  for (const auto &TL : TLEsAndLAs) {
    const auto &tle = TL.first;
    const auto &la = TL.second;
    std::cout << "[+] [" << (++count) << '/' << nTles << "] " << '('
              << tle.Name() << "): LookAngle: " << la << std::endl;
  }
}